

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O0

mz_bool mz_zip_end(mz_zip_archive *pZip)

{
  mz_zip_archive *pZip_local;
  
  if (pZip == (mz_zip_archive *)0x0) {
    pZip_local._4_4_ = 0;
  }
  else if (pZip->m_zip_mode == MZ_ZIP_MODE_READING) {
    pZip_local._4_4_ = mz_zip_reader_end(pZip);
  }
  else if ((pZip->m_zip_mode == MZ_ZIP_MODE_WRITING) ||
          (pZip->m_zip_mode == MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED)) {
    pZip_local._4_4_ = mz_zip_writer_end(pZip);
  }
  else {
    pZip_local._4_4_ = 0;
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_end(mz_zip_archive *pZip)
{
    if (!pZip)
        return MZ_FALSE;

    if (pZip->m_zip_mode == MZ_ZIP_MODE_READING)
        return mz_zip_reader_end(pZip);
#ifndef MINIZ_NO_ARCHIVE_WRITING_APIS
    else if ((pZip->m_zip_mode == MZ_ZIP_MODE_WRITING) || (pZip->m_zip_mode == MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED))
        return mz_zip_writer_end(pZip);
#endif

    return MZ_FALSE;
}